

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disflow.c
# Opt level: O0

void fill_flow_field_borders(double *flow,int width,int height,int stride)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 *puVar3;
  long lVar4;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  size_t length_1;
  double *row_3;
  int i_3;
  double *bottom_row;
  size_t length;
  double *row_2;
  int i_2;
  double *top_row;
  int j_1;
  double right;
  double *row_1;
  int i_1;
  int j;
  double left;
  double *row;
  int i;
  int bottom_index;
  int top_index;
  int right_index;
  int left_index;
  int local_84;
  int local_64;
  int local_54;
  int local_40;
  int local_3c;
  int local_28;
  
  iVar2 = in_EDX + -1;
  for (local_28 = 0; local_28 <= iVar2; local_28 = local_28 + 1) {
    puVar3 = (undefined8 *)(in_RDI + (long)(local_28 * in_ECX) * 8);
    uVar1 = *puVar3;
    for (local_3c = -2; local_3c < 0; local_3c = local_3c + 1) {
      puVar3[local_3c] = uVar1;
    }
  }
  for (local_40 = 0; local_40 <= iVar2; local_40 = local_40 + 1) {
    lVar4 = in_RDI + (long)(local_40 * in_ECX) * 8;
    uVar1 = *(undefined8 *)(lVar4 + (long)(in_ESI + -1) * 8);
    for (local_54 = in_ESI; local_54 < in_ESI + 2; local_54 = local_54 + 1) {
      *(undefined8 *)(lVar4 + (long)local_54 * 8) = uVar1;
    }
  }
  for (local_64 = -2; local_64 < 0; local_64 = local_64 + 1) {
    memcpy((void *)(in_RDI + (long)(local_64 * in_ECX) * 8 + -0x10),(void *)(in_RDI + -0x10),
           (long)(in_ESI + 4) << 3);
  }
  for (local_84 = in_EDX; local_84 < in_EDX + 2; local_84 = local_84 + 1) {
    memcpy((void *)(in_RDI + (long)(local_84 * in_ECX) * 8 + -0x10),
           (void *)(in_RDI + (long)(iVar2 * in_ECX) * 8 + -0x10),(long)(in_ESI + 4) << 3);
  }
  return;
}

Assistant:

static void fill_flow_field_borders(double *flow, int width, int height,
                                    int stride) {
  // Calculate the bounds of the rectangle which was filled in by
  // compute_flow_field() before calling this function.
  // These indices are inclusive on both ends.
  const int left_index = FLOW_BORDER_INNER;
  const int right_index = (width - FLOW_BORDER_INNER - 1);
  const int top_index = FLOW_BORDER_INNER;
  const int bottom_index = (height - FLOW_BORDER_INNER - 1);

  // Left area
  for (int i = top_index; i <= bottom_index; i += 1) {
    double *row = flow + i * stride;
    const double left = row[left_index];
    for (int j = -FLOW_BORDER_OUTER; j < left_index; j++) {
      row[j] = left;
    }
  }

  // Right area
  for (int i = top_index; i <= bottom_index; i += 1) {
    double *row = flow + i * stride;
    const double right = row[right_index];
    for (int j = right_index + 1; j < width + FLOW_BORDER_OUTER; j++) {
      row[j] = right;
    }
  }

  // Top area
  const double *top_row = flow + top_index * stride - FLOW_BORDER_OUTER;
  for (int i = -FLOW_BORDER_OUTER; i < top_index; i++) {
    double *row = flow + i * stride - FLOW_BORDER_OUTER;
    size_t length = width + 2 * FLOW_BORDER_OUTER;
    memcpy(row, top_row, length * sizeof(*row));
  }

  // Bottom area
  const double *bottom_row = flow + bottom_index * stride - FLOW_BORDER_OUTER;
  for (int i = bottom_index + 1; i < height + FLOW_BORDER_OUTER; i++) {
    double *row = flow + i * stride - FLOW_BORDER_OUTER;
    size_t length = width + 2 * FLOW_BORDER_OUTER;
    memcpy(row, bottom_row, length * sizeof(*row));
  }
}